

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::clearColorReference(Surface *ref,Vec4 *clearColor)

{
  PixelBufferAccess local_40;
  Vec4 *local_18;
  Vec4 *clearColor_local;
  Surface *ref_local;
  
  local_18 = clearColor;
  clearColor_local = (Vec4 *)ref;
  tcu::Surface::getAccess(&local_40,ref);
  tcu::clear(&local_40,local_18);
  return;
}

Assistant:

void clearColorReference (tcu::Surface* ref, const tcu::Vec4& clearColor)
{
	tcu::clear(ref->getAccess(), clearColor);
}